

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.hpp
# Opt level: O3

void diy::kdtree_sampling<Block,diy::Point<float,2u>>
               (Master *master,Assigner *assigner,int dim,ContinuousBounds *domain,
               offset_in_Block_to_vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_>
               points,size_t samples,bool wrap)

{
  pointer *ppBVar1;
  RegularLink<diy::Bounds<float>_> *this;
  iterator iVar2;
  size_t sVar3;
  bool bVar4;
  BlockID BVar5;
  BlockID BVar6;
  int iVar7;
  mapped_type *pmVar8;
  runtime_error *this_00;
  long lVar9;
  uint nblocks;
  int iVar10;
  ulong uVar11;
  string_view format_str;
  format_args args;
  KDTreeSamplingPartition<Block,_diy::Point<float,_2U>_> kdtree_partition;
  KDTreePartners partners;
  allocator<int> local_451;
  BlockID local_450;
  Bounds *local_448;
  int local_440;
  undefined4 local_43c;
  long local_438;
  vector<diy::BlockID,std::allocator<diy::BlockID>> *local_430;
  vector<diy::Direction,_std::allocator<diy::Direction>_> *local_428;
  DirVec *local_420;
  DirMap *local_418;
  vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_> *local_410;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_408;
  pointer local_3c8;
  pointer local_3c0;
  Assigner *local_3b8;
  Master *local_3b0;
  ulong local_3a8;
  size_t local_3a0;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_398;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_358;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_318;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_2d8;
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288 [2];
  size_t local_268;
  _Base_ptr local_260;
  
  nblocks = assigner->nblocks_;
  local_448 = domain;
  if ((nblocks & nblocks - 1) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_408._0_8_ = ZEXT48((uint)assigner->nblocks_);
    format_str.size_ = 1;
    format_str.data_ = (char *)0x3f;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                  )samples;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_408;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_298,
               (detail *)"KD-tree requires a number of blocks that\'s a power of 2, got {}",
               format_str,args);
    std::runtime_error::runtime_error(this_00,(string *)local_298);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0 < (int)((ulong)((long)(master->blocks_).elements_.
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(master->blocks_).elements_.
                             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3)) {
    local_3a0 = (size_t)dim;
    local_3a8 = (ulong)(uint)dim;
    lVar9 = 0;
    local_440 = dim;
    local_3c8 = (pointer)points;
    local_3c0 = (pointer)samples;
    local_3b8 = assigner;
    local_3b0 = master;
    do {
      this = (RegularLink<diy::Bounds<float>_> *)
             (master->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
             super__Vector_impl_data._M_start[lVar9];
      local_438 = lVar9;
      RegularLink<diy::Bounds<float>_>::RegularLink
                ((RegularLink<diy::Bounds<float>_> *)local_298,dim,local_448,local_448);
      RegularLink<diy::Bounds<float>_>::operator=
                (this,(RegularLink<diy::Bounds<float>_> *)local_298);
      RegularLink<diy::Bounds<float>_>::~RegularLink((RegularLink<diy::Bounds<float>_> *)local_298);
      if (wrap) {
        local_450.gid =
             (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[local_438];
        local_450.proc = (master->comm_).rank_;
        bVar4 = 0 < dim;
        master = local_3b0;
        dim = local_440;
        if (bVar4) {
          local_430 = (vector<diy::BlockID,std::allocator<diy::BlockID>> *)
                      &(this->super_Registrar<diy::RegularLink<diy::Bounds<float>_>_>).super_Link.
                       neighbors_;
          local_410 = &this->nbr_bounds_;
          local_418 = &this->dir_map_;
          local_420 = &this->dir_vec_;
          local_428 = &this->wrap_;
          uVar11 = 0;
          do {
            sVar3 = local_3a0;
            local_408._0_8_ = local_408._0_8_ & 0xffffffff00000000;
            itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                      ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)local_298,local_3a0,
                       (int *)&local_408,(allocator<int> *)&local_43c);
            local_43c = 0;
            itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                      (&local_408,sVar3,(int *)&local_43c,&local_451);
            ((int *)local_298._8_8_)[uVar11] = -1;
            local_408.m_begin[uVar11] = -1;
            iVar2._M_current =
                 (this->super_Registrar<diy::RegularLink<diy::Bounds<float>_>_>).super_Link.
                 neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->super_Registrar<diy::RegularLink<diy::Bounds<float>_>_>).super_Link.
                neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<diy::BlockID,std::allocator<diy::BlockID>>::
              _M_realloc_insert<diy::BlockID_const&>(local_430,iVar2,&local_450);
            }
            else {
              BVar5.proc = local_450.proc;
              BVar5.gid = local_450.gid;
              *iVar2._M_current = BVar5;
              ppBVar1 = &(this->super_Registrar<diy::RegularLink<diy::Bounds<float>_>_>).super_Link.
                         neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppBVar1 = *ppBVar1 + 1;
            }
            Catch::clara::std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>::
            push_back(local_410,local_448);
            itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                      (&local_2d8,(small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)local_298,
                       (allocator<int> *)&local_43c);
            sVar3 = (this->dir_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
            pmVar8 = Catch::clara::std::
                     map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
                     ::operator[](local_418,(key_type *)&local_2d8);
            *pmVar8 = (mapped_type)sVar3;
            Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::push_back
                      (local_420,(value_type *)&local_2d8);
            local_2d8.m_end = local_2d8.m_begin;
            if (local_2d8.m_dynamic_data != (pointer)0x0) {
              operator_delete(local_2d8.m_dynamic_data,local_2d8.m_dynamic_capacity << 2);
            }
            itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                      (&local_318,&local_408,(allocator<int> *)&local_43c);
            Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::push_back
                      (local_428,(value_type *)&local_318);
            local_318.m_end = local_318.m_begin;
            if (local_318.m_dynamic_data != (pointer)0x0) {
              operator_delete(local_318.m_dynamic_data,local_318.m_dynamic_capacity << 2);
            }
            ((int *)local_298._8_8_)[uVar11] = 1;
            local_408.m_begin[uVar11] = 1;
            iVar2._M_current =
                 (this->super_Registrar<diy::RegularLink<diy::Bounds<float>_>_>).super_Link.
                 neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->super_Registrar<diy::RegularLink<diy::Bounds<float>_>_>).super_Link.
                neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<diy::BlockID,std::allocator<diy::BlockID>>::
              _M_realloc_insert<diy::BlockID_const&>(local_430,iVar2,&local_450);
            }
            else {
              BVar6.proc = local_450.proc;
              BVar6.gid = local_450.gid;
              *iVar2._M_current = BVar6;
              ppBVar1 = &(this->super_Registrar<diy::RegularLink<diy::Bounds<float>_>_>).super_Link.
                         neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppBVar1 = *ppBVar1 + 1;
            }
            Catch::clara::std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>::
            push_back(local_410,local_448);
            itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                      (&local_358,(small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)local_298,
                       (allocator<int> *)&local_43c);
            sVar3 = (this->dir_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
            pmVar8 = Catch::clara::std::
                     map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
                     ::operator[](local_418,(key_type *)&local_358);
            *pmVar8 = (mapped_type)sVar3;
            Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::push_back
                      (local_420,(value_type *)&local_358);
            local_358.m_end = local_358.m_begin;
            if (local_358.m_dynamic_data != (pointer)0x0) {
              operator_delete(local_358.m_dynamic_data,local_358.m_dynamic_capacity << 2);
            }
            itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                      (&local_398,&local_408,(allocator<int> *)&local_43c);
            Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::push_back
                      (local_428,(value_type *)&local_398);
            local_398.m_end = local_398.m_begin;
            if (local_398.m_dynamic_data != (pointer)0x0) {
              operator_delete(local_398.m_dynamic_data,local_398.m_dynamic_capacity << 2);
            }
            local_408.m_end = local_408.m_begin;
            if (local_408.m_dynamic_data != (pointer)0x0) {
              operator_delete(local_408.m_dynamic_data,local_408.m_dynamic_capacity << 2);
            }
            local_288[0]._M_allocated_capacity = local_298._8_8_;
            if (local_260 != (_Base_ptr)0x0) {
              operator_delete(local_260,local_268 << 2);
            }
            uVar11 = uVar11 + 1;
            master = local_3b0;
            dim = local_440;
          } while (local_3a8 != uVar11);
        }
      }
      lVar9 = local_438 + 1;
    } while (lVar9 < (int)((ulong)((long)(master->blocks_).elements_.
                                         super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                  (long)(master->blocks_).elements_.
                                        super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 3));
    nblocks = local_3b8->nblocks_;
    points = (offset_in_Block_to_vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_>
              )local_3c8;
    samples = (size_t)local_3c0;
    assigner = local_3b8;
  }
  local_408._0_4_ = dim;
  local_408.m_begin = (pointer)points;
  local_408.m_end = (pointer)samples;
  detail::KDTreePartners::KDTreePartners((KDTreePartners *)local_298,dim,nblocks,wrap,local_448);
  reduce<diy::detail::KDTreeSamplingPartition<Block,diy::Point<float,2u>>,diy::detail::KDTreePartners,diy::detail::ReduceNeverSkip>
            (master,assigner,(KDTreePartners *)local_298,
             (KDTreeSamplingPartition<Block,_diy::Point<float,_2U>_> *)&local_408,
             (ReduceNeverSkip *)&local_450);
  if ((int)((ulong)((long)(master->blocks_).elements_.
                          super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(master->blocks_).elements_.
                         super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) < 1) {
    iVar10 = 0;
  }
  else {
    lVar9 = 0;
    iVar10 = 0;
    do {
      iVar7 = Link::size_unique((master->links_).
                                super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar9]);
      iVar10 = iVar10 + iVar7;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (int)((ulong)((long)(master->blocks_).elements_.
                                         super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                  (long)(master->blocks_).elements_.
                                        super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 3));
  }
  master->expected_ = iVar10;
  detail::KDTreePartners::~KDTreePartners((KDTreePartners *)local_298);
  return;
}

Assistant:

void kdtree_sampling
               (Master&                         master,      //!< master object
                const Assigner&                 assigner,    //!< assigner object
                int                             dim,         //!< dimensionality
                const ContinuousBounds&         domain,      //!< global data extents
                std::vector<Point>  Block::*    points,      //!< input points to sort into kd-tree
                size_t                          samples,     //!< number of samples to take in each block
                bool                            wrap = false)//!< periodic boundaries in all dimensions
    {
        if (assigner.nblocks() & (assigner.nblocks() - 1))
            throw std::runtime_error(fmt::format("KD-tree requires a number of blocks that's a power of 2, got {}", assigner.nblocks()));

        typedef     diy::RegularContinuousLink      RCLink;

        for (int i = 0; i < static_cast<int>(master.size()); ++i)
        {
            RCLink* link   = static_cast<RCLink*>(master.link(i));
            *link = RCLink(dim, domain, domain);

            if (wrap)       // set up the links to self
            {
                diy::BlockID self = { master.gid(i), master.communicator().rank() };
                for (int j = 0; j < dim; ++j)
                {
                    diy::Direction dir(dim,0), wrap_dir(dim,0);

                    // left
                    dir[j] = -1; wrap_dir[j] = -1;
                    link->add_neighbor(self);
                    link->add_bounds(domain);
                    link->add_direction(dir);
                    link->add_wrap(wrap_dir);

                    // right
                    dir[j] = 1; wrap_dir[j] = 1;
                    link->add_neighbor(self);
                    link->add_bounds(domain);
                    link->add_direction(dir);
                    link->add_wrap(wrap_dir);
                }
            }
        }

        detail::KDTreeSamplingPartition<Block,Point>    kdtree_partition(dim, points, samples);

        detail::KDTreePartners                          partners(dim, assigner.nblocks(), wrap, domain);
        reduce(master, assigner, partners, kdtree_partition);

        // update master.expected to match the links
        int expected = 0;
        for (int i = 0; i < static_cast<int>(master.size()); ++i)
            expected += master.link(i)->size_unique();
        master.set_expected(expected);
    }